

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.h
# Opt level: O2

string * __thiscall Symbol::to_string_abi_cxx11_(string *__return_storage_ptr__,Symbol *this)

{
  ostream *poVar1;
  int type;
  stringstream osf;
  string sStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  Token::get_typename_abi_cxx11_(&sStack_1b8,(Token *)(ulong)(uint)this->type,type);
  poVar1 = std::operator<<(local_188,(string *)&sStack_1b8);
  poVar1 = std::operator<<(poVar1,"\t\t");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string to_string() const {
        stringstream osf;
        osf << Token::get_typename(type) << "\t\t" << name << endl;
        return osf.str();
    }